

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O2

bool __thiscall
cmBuildCommand::MainSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  cmCommand *pcVar1;
  int iVar2;
  bool bVar3;
  pointer pbVar4;
  ulong uVar5;
  cmGlobalGenerator *this_01;
  ostream *poVar6;
  bool bVar7;
  pointer pbVar8;
  string *psVar9;
  int iVar10;
  ulong uVar11;
  allocator<char> local_239;
  cmCommand *local_238;
  string configuration;
  string local_210;
  pointer local_1f0;
  string target;
  string project_name;
  string makecommand;
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 == pbVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&makecommand,"requires at least one argument naming a CMake variable",
               (allocator<char> *)&configuration);
    cmCommand::SetError(&this->super_cmCommand,&makecommand);
    std::__cxx11::string::~string((string *)&makecommand);
    bVar7 = false;
  }
  else {
    configuration._M_dataplus._M_p = (pointer)&configuration.field_2;
    configuration._M_string_length = 0;
    project_name._M_dataplus._M_p = (pointer)&project_name.field_2;
    project_name._M_string_length = 0;
    iVar10 = 0;
    configuration.field_2._M_local_buf[0] = '\0';
    project_name.field_2._M_local_buf[0] = '\0';
    target._M_dataplus._M_p = (pointer)&target.field_2;
    target._M_string_length = 0;
    target.field_2._M_local_buf[0] = '\0';
    uVar11 = 1;
    local_238 = &this->super_cmCommand;
    local_1f0 = pbVar8;
    for (; uVar5 = (long)pbVar4 - (long)pbVar8 >> 5, bVar7 = uVar5 <= uVar11, uVar11 < uVar5;
        uVar11 = (ulong)((int)uVar11 + 1)) {
      bVar3 = std::operator==(pbVar8 + uVar11,"CONFIGURATION");
      iVar2 = 1;
      if (!bVar3) {
        bVar3 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar11,"PROJECT_NAME");
        iVar2 = 2;
        if (!bVar3) {
          bVar3 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11,"TARGET");
          iVar2 = 3;
          if (!bVar3) {
            psVar9 = &configuration;
            if (iVar10 != 1) {
              if (iVar10 == 3) {
                psVar9 = &target;
              }
              else {
                if (iVar10 != 2) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&makecommand);
                  poVar6 = std::operator<<((ostream *)&makecommand,"unknown argument \"");
                  pcVar1 = local_238;
                  poVar6 = std::operator<<(poVar6,(string *)
                                                  ((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar11));
                  std::operator<<(poVar6,"\"");
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(pcVar1,&local_210);
                  std::__cxx11::string::~string((string *)&local_210);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&makecommand);
                  goto LAB_0016e496;
                }
                psVar9 = &project_name;
              }
            }
            std::__cxx11::string::_M_assign((string *)psVar9);
            iVar2 = 0;
          }
        }
      }
      iVar10 = iVar2;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (configuration._M_string_length == 0) {
      cmsys::SystemTools::GetEnv("CMAKE_CONFIG_TYPE",&configuration);
      if (configuration._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&configuration);
      }
    }
    pcVar1 = local_238;
    if (project_name._M_string_length != 0) {
      this_00 = local_238->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&makecommand,"Ignoring PROJECT_NAME option because it has no effect.",
                 (allocator<char> *)&local_210);
      cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&makecommand);
      std::__cxx11::string::~string((string *)&makecommand);
    }
    this_01 = cmMakefile::GetGlobalGenerator(pcVar1->Makefile);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"",&local_239);
    bVar3 = cmMakefile::IgnoreErrorsCMP0061(pcVar1->Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&makecommand,this_01,&target,&configuration,&local_210,bVar3);
    std::__cxx11::string::~string((string *)&local_210);
    cmMakefile::AddDefinition(pcVar1->Makefile,local_1f0,makecommand._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&makecommand);
LAB_0016e496:
    std::__cxx11::string::~string((string *)&target);
    std::__cxx11::string::~string((string *)&project_name);
    std::__cxx11::string::~string((string *)&configuration);
  }
  return bVar7;
}

Assistant:

bool cmBuildCommand::MainSignature(std::vector<std::string> const& args)
{
  if (args.empty()) {
    this->SetError("requires at least one argument naming a CMake variable");
    return false;
  }

  // The cmake variable in which to store the result.
  std::string const& variable = args[0];

  // Parse remaining arguments.
  std::string configuration;
  std::string project_name;
  std::string target;
  enum Doing
  {
    DoingNone,
    DoingConfiguration,
    DoingProjectName,
    DoingTarget
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "CONFIGURATION") {
      doing = DoingConfiguration;
    } else if (args[i] == "PROJECT_NAME") {
      doing = DoingProjectName;
    } else if (args[i] == "TARGET") {
      doing = DoingTarget;
    } else if (doing == DoingConfiguration) {
      doing = DoingNone;
      configuration = args[i];
    } else if (doing == DoingProjectName) {
      doing = DoingNone;
      project_name = args[i];
    } else if (doing == DoingTarget) {
      doing = DoingNone;
      target = args[i];
    } else {
      std::ostringstream e;
      e << "unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
    }
  }

  // If null/empty CONFIGURATION argument, cmake --build uses 'Debug'
  // in the currently implemented multi-configuration global generators...
  // so we put this code here to end up with the same default configuration
  // as the original 2-arg build_command signature:
  //
  if (configuration.empty()) {
    cmSystemTools::GetEnv("CMAKE_CONFIG_TYPE", configuration);
  }
  if (configuration.empty()) {
    configuration = "Release";
  }

  if (!project_name.empty()) {
    this->Makefile->IssueMessage(
      MessageType::AUTHOR_WARNING,
      "Ignoring PROJECT_NAME option because it has no effect.");
  }

  std::string makecommand =
    this->Makefile->GetGlobalGenerator()->GenerateCMakeBuildCommand(
      target, configuration, "", this->Makefile->IgnoreErrorsCMP0061());

  this->Makefile->AddDefinition(variable, makecommand.c_str());

  return true;
}